

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O3

void __thiscall flatbuffers::CodeWriter::operator+=(CodeWriter *this,string *text)

{
  char *pcVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  iterator iVar5;
  ostream *poVar6;
  int iVar7;
  string key;
  key_type local_70;
  long *local_50 [2];
  long local_40 [2];
  
  if (((this[0x1dc] == (CodeWriter)0x0) && (text->_M_string_length != 0)) &&
     (iVar7 = *(int *)(this + 0x1d8), iVar7 != 0)) {
    do {
      std::ostream::write((char *)(this + 0x40),*(long *)(this + 0x1b8));
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
  }
  uVar3 = std::__cxx11::string::find((char *)text,0x1d140d,0);
  if (uVar3 != 0xffffffffffffffff) {
    do {
      uVar4 = std::__cxx11::string::find((char *)text,0x1c6e5a,0);
      if ((uVar4 == 0xffffffffffffffff) || (uVar4 < uVar3)) break;
      std::ostream::write((char *)(this + 0x40),(long)(text->_M_dataplus)._M_p);
      std::__cxx11::string::substr((ulong)&local_70,(ulong)text);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this,&local_70);
      if (iVar5._M_node == (_Base_ptr)(this + 8)) {
        __assert_fail("false && \"could not find key\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/code_generators.cpp"
                      ,0x58,"void flatbuffers::CodeWriter::operator+=(std::string)");
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(this + 0x40),*(char **)(iVar5._M_node + 2),
                 (long)iVar5._M_node[2]._M_parent);
      std::__cxx11::string::substr((ulong)local_50,(ulong)text);
      std::__cxx11::string::operator=((string *)text,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      uVar3 = std::__cxx11::string::find((char *)text,0x1d140d,0);
    } while (uVar3 != 0xffffffffffffffff);
  }
  pcVar1 = (text->_M_dataplus)._M_p;
  sVar2 = text->_M_string_length;
  if ((sVar2 == 0) || (pcVar1[sVar2 - 1] != '\\')) {
    this[0x1dc] = (CodeWriter)0x0;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(this + 0x40),pcVar1,sVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  else {
    std::__cxx11::string::pop_back();
    this[0x1dc] = (CodeWriter)0x1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(this + 0x40),(text->_M_dataplus)._M_p,text->_M_string_length);
  }
  return;
}

Assistant:

void CodeWriter::operator+=(std::string text) {
  if (!ignore_ident_ && !text.empty()) AppendIdent(stream_);

  while (true) {
    auto begin = text.find("{{");
    if (begin == std::string::npos) { break; }

    auto end = text.find("}}");
    if (end == std::string::npos || end < begin) { break; }

    // Write all the text before the first {{ into the stream.
    stream_.write(text.c_str(), begin);

    // The key is between the {{ and }}.
    const std::string key = text.substr(begin + 2, end - begin - 2);

    // Find the value associated with the key.  If it exists, write the
    // value into the stream, otherwise write the key itself into the stream.
    auto iter = value_map_.find(key);
    if (iter != value_map_.end()) {
      const std::string &value = iter->second;
      stream_ << value;
    } else {
      FLATBUFFERS_ASSERT(false && "could not find key");
      stream_ << key;
    }

    // Update the text to everything after the }}.
    text = text.substr(end + 2);
  }
  if (!text.empty() && text.back() == '\\') {
    text.pop_back();
    ignore_ident_ = true;
    stream_ << text;
  } else {
    ignore_ident_ = false;
    stream_ << text << std::endl;
  }
}